

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

Api RtMidi::getCompiledApiByName(string *name)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  return (uint)(iVar1 == 0) * 2;
}

Assistant:

RtMidi::Api RtMidi :: getCompiledApiByName( const std::string &name )
{
  unsigned int i=0;
  for (i = 0; i < rtmidi_num_compiled_apis; ++i)
    if (name == rtmidi_api_names[rtmidi_compiled_apis[i]][0])
      return rtmidi_compiled_apis[i];
  return RtMidi::UNSPECIFIED;
}